

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

void Gia_Iso2ManCheckIsoClassOne
               (Gia_Man_t *p,Vec_Int_t *vClass,Vec_Int_t *vRoots,Vec_Int_t *vVec0,Vec_Int_t *vVec1,
               Vec_Int_t *vMap0,Vec_Int_t *vMap1,Vec_Int_t *vNewClass)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int local_4c;
  Gia_Man_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  vNewClass->nSize = 0;
  if (1 < vClass->nSize) {
    local_4c = *vClass->pArray;
    uVar5 = 1;
    local_48 = p;
    Gia_Iso2ManCollectOrder(p,&local_4c,1,vRoots,vVec0,vMap0);
    iVar2 = vClass->nSize;
    if (1 < iVar2) {
      uVar5 = 1;
      lVar4 = 1;
      local_40 = vMap0;
      local_38 = vRoots;
      do {
        iVar2 = vClass->pArray[lVar4];
        local_4c = iVar2;
        Gia_Iso2ManCollectOrder(local_48,&local_4c,1,local_38,vVec1,vMap1);
        if (vVec0->nSize == vVec1->nSize) {
          iVar1 = Gia_Iso2ManCheckIsoPair(local_48,vVec0,vVec1,local_40,vMap1);
          if (iVar1 == 0) goto LAB_00757966;
          if (((int)uVar5 < 0) || (vClass->nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar3 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          vClass->pArray[uVar3] = iVar2;
        }
        else {
LAB_00757966:
          Vec_IntPush(vNewClass,iVar2);
        }
        lVar4 = lVar4 + 1;
        iVar2 = vClass->nSize;
      } while (lVar4 < iVar2);
    }
    if (iVar2 < (int)uVar5) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vClass->nSize = uVar5;
  }
  return;
}

Assistant:

void Gia_Iso2ManCheckIsoClassOne( Gia_Man_t * p, Vec_Int_t * vClass, Vec_Int_t * vRoots, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1, Vec_Int_t * vNewClass )
{
    int i, k = 1, iPo;
    Vec_IntClear( vNewClass );
    if ( Vec_IntSize(vClass) <= 1 )
        return;
    assert( Vec_IntSize(vClass) > 1 );
    iPo = Vec_IntEntry( vClass, 0 );
    Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec0, vMap0 );
    Vec_IntForEachEntryStart( vClass, iPo, i, 1 )
    {
        Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec1, vMap1 );
        if ( Vec_IntSize(vVec0) == Vec_IntSize(vVec1) && Gia_Iso2ManCheckIsoPair(p, vVec0, vVec1, vMap0, vMap1) )
            Vec_IntWriteEntry( vClass, k++, iPo );
        else
            Vec_IntPush( vNewClass, iPo );
    }
    Vec_IntShrink( vClass, k );
}